

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemTxResult
address_space_rw_riscv64
          (AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *buf,hwaddr len,_Bool is_write)

{
  _Bool is_write_local;
  hwaddr len_local;
  void *buf_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  MemTxAttrs attrs_local;
  
  if (is_write) {
    as_local._4_4_ = address_space_write_riscv64(as,addr,attrs,buf,len);
  }
  else {
    as_local._4_4_ = address_space_read_full_riscv64(as,addr,attrs,buf,len);
  }
  return as_local._4_4_;
}

Assistant:

MemTxResult address_space_rw(AddressSpace *as, hwaddr addr, MemTxAttrs attrs,
                             void *buf, hwaddr len, bool is_write)
{
    if (is_write) {
        return address_space_write(as, addr, attrs, buf, len);
    } else {
        return address_space_read_full(as, addr, attrs, buf, len);
    }
}